

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O3

size_t ListFile_GetNextLine(void *pvListFile,char *szBuffer,size_t nMaxChars)

{
  size_t __n;
  char *szLineBegin;
  char *local_28;
  char *local_20;
  
  local_28 = (char *)0x0;
  __n = ListFile_GetNextLine(pvListFile,&local_28,&local_20);
  if (nMaxChars < __n) {
    SetLastError(0x69);
    __n = 0;
  }
  else {
    memcpy(szBuffer,local_28,__n);
    szBuffer[__n] = '\0';
  }
  return __n;
}

Assistant:

size_t ListFile_GetNextLine(void * pvListFile, char * szBuffer, size_t nMaxChars)
{
    const char * szLineBegin = NULL;
    const char * szLineEnd = NULL;
    size_t nLength;

    // Retrieve the next line
    nLength = ListFile_GetNextLine(pvListFile, &szLineBegin, &szLineEnd);

    // Check the length
    if(nLength > nMaxChars)
    {
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return 0;
    }

    // Copy the line to the user buffer
    memcpy(szBuffer, szLineBegin, nLength);
    szBuffer[nLength] = 0;
    return nLength;
}